

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handypack.hpp
# Opt level: O2

void NHandyPack::
     TSetSerializer<std::unordered_set<wchar_t,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<wchar_t>_>,_wchar_t>
     ::Load(istream *in,
           unordered_set<wchar_t,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<wchar_t>_>
           *object)

{
  size_t i;
  ulong uVar1;
  wchar_t local_30;
  uint local_2c;
  wchar_t obj;
  uint32_t size;
  
  std::istream::read((char *)in,(long)&local_2c);
  std::
  _Hashtable<wchar_t,_wchar_t,_std::allocator<wchar_t>,_std::__detail::_Identity,_std::equal_to<wchar_t>,_std::hash<wchar_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::clear(&object->_M_h);
  for (uVar1 = 0; uVar1 < local_2c; uVar1 = uVar1 + 1) {
    TPodSerializer<wchar_t>::Load(in,&local_30);
    std::__detail::
    _Insert<wchar_t,_wchar_t,_std::allocator<wchar_t>,_std::__detail::_Identity,_std::equal_to<wchar_t>,_std::hash<wchar_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
    ::insert((_Insert<wchar_t,_wchar_t,_std::allocator<wchar_t>,_std::__detail::_Identity,_std::equal_to<wchar_t>,_std::hash<wchar_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
              *)object,&local_30);
  }
  return;
}

Assistant:

static inline void Load(std::istream& in, TVec& object) {
        uint32_t size;
        in.read((char*)(&size), sizeof(size));
        object.clear();
        for (size_t i = 0; i < size; ++i) {
            TObj obj;
            NHandyPack::Load(in, obj);
            object.insert(std::move(obj));
        }
    }